

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

int Llb_CoreExperiment(Aig_Man_t *pInit,Aig_Man_t *pAig,Gia_ParLlb_t *pPars,Vec_Ptr_t *vResult,
                      abctime TimeTarget)

{
  Llb_Img_t *p_00;
  Vec_Ptr_t *pVVar1;
  Llb_Img_t *p;
  int RetValue;
  abctime TimeTarget_local;
  Vec_Ptr_t *vResult_local;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAig_local;
  Aig_Man_t *pInit_local;
  
  p_00 = Llb_CoreStart(pInit,pAig,pPars);
  pVVar1 = Llb_CoreConstructAll(pAig,vResult,p_00->vVarsNs,TimeTarget);
  p_00->vDdMans = pVVar1;
  if (p_00->vDdMans == (Vec_Ptr_t *)0x0) {
    if (pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) while deriving the partitions.\n",
             (ulong)(uint)pPars->TimeLimit);
    }
    Llb_CoreStop(p_00);
    pInit_local._4_4_ = -1;
  }
  else {
    pInit_local._4_4_ = Llb_CoreReachability(p_00);
    Llb_CoreStop(p_00);
  }
  return pInit_local._4_4_;
}

Assistant:

int Llb_CoreExperiment( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t * pPars, Vec_Ptr_t * vResult, abctime TimeTarget )
{
    int RetValue;
    Llb_Img_t * p;
//    printf( "\n" );
//    pPars->fVerbose = 1;
    p = Llb_CoreStart( pInit, pAig, pPars );
    p->vDdMans = Llb_CoreConstructAll( pAig, vResult, p->vVarsNs, TimeTarget );
    if ( p->vDdMans == NULL )
    {
        if ( !pPars->fSilent )
            printf( "Reached timeout (%d seconds) while deriving the partitions.\n", pPars->TimeLimit );
        Llb_CoreStop( p );
        return -1;
    }
    RetValue = Llb_CoreReachability( p );
    Llb_CoreStop( p );
    return RetValue;
}